

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::MaterialNode> *mnode)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 id;
  long *plVar2;
  mapped_type_conflict1 *pmVar3;
  OBJMaterial *pOVar4;
  ostream *poVar5;
  ThinDielectricMaterial *pTVar6;
  MetalMaterial *pMVar7;
  VelvetMaterial *pVVar8;
  DielectricMaterial *pDVar9;
  MetallicPaintMaterial *pMVar10;
  MatteMaterial *pMVar11;
  MirrorMaterial *pMVar12;
  long *plVar13;
  runtime_error *this_00;
  Node *pNVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  ulong uVar17;
  Ref<embree::SceneGraph::Node> node;
  key_type local_c0;
  long local_b8;
  undefined1 local_b0 [32];
  Ref<embree::MirrorMaterial> local_90;
  Ref<embree::MatteMaterial> local_88;
  Ref<embree::MetallicPaintMaterial> local_80;
  Ref<embree::DielectricMaterial> local_78;
  Ref<embree::VelvetMaterial> local_70;
  Ref<embree::MetalMaterial> local_68;
  Ref<embree::ThinDielectricMaterial> local_60;
  Ref<embree::OBJMaterial> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->referenceMaterials == true) {
    if (this->ident != 0) {
      uVar17 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
        uVar17 = uVar17 + 1;
      } while (uVar17 < this->ident);
    }
    std::operator+(&local_50,"<material id=\"",&(mnode->ptr->super_Node).name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    pNVar14 = (Node *)(plVar2 + 2);
    if ((Node *)*plVar2 == pNVar14) {
      local_b0._0_8_ = (pNVar14->super_RefCount)._vptr_RefCount;
      local_b0._8_8_ = plVar2[3];
      local_c0.ptr = (Node *)local_b0;
    }
    else {
      local_b0._0_8_ = (pNVar14->super_RefCount)._vptr_RefCount;
      local_c0.ptr = (Node *)*plVar2;
    }
    local_b8 = plVar2[1];
    *plVar2 = (long)pNVar14;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x10,(char *)local_c0.ptr,local_b8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_c0.ptr != (Node *)local_b0) {
      operator_delete(local_c0.ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    local_c0.ptr = &mnode->ptr->super_Node;
    if (local_c0.ptr != (Node *)0x0) {
      (*(((Node *)&(local_c0.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
    }
    p_Var1 = &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var16 = (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var15 = &p_Var1->_M_header;
    for (; p_Var16 != (_Base_ptr)0x0;
        p_Var16 = (&p_Var16->_M_left)[*(Node **)(p_Var16 + 1) < local_c0.ptr]) {
      if (*(Node **)(p_Var16 + 1) >= local_c0.ptr) {
        p_Var15 = p_Var16;
      }
    }
    p_Var16 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
       (p_Var16 = p_Var15, local_c0.ptr < *(Node **)(p_Var15 + 1))) {
      p_Var16 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var16 == p_Var1) {
      id = this->currentNodeID;
      this->currentNodeID = id + 1;
      pmVar3 = std::
               map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
               ::operator[](&this->nodeMap,&local_c0);
      *pmVar3 = id;
      if (mnode->ptr == (MaterialNode *)0x0) {
        pOVar4 = (OBJMaterial *)0x0;
      }
      else {
        pOVar4 = (OBJMaterial *)
                 __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                &OBJMaterial::typeinfo,0);
      }
      if (pOVar4 == (OBJMaterial *)0x0) {
        if (mnode->ptr == (MaterialNode *)0x0) {
          pTVar6 = (ThinDielectricMaterial *)0x0;
        }
        else {
          pTVar6 = (ThinDielectricMaterial *)
                   __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                  &ThinDielectricMaterial::typeinfo,0);
        }
        if (pTVar6 == (ThinDielectricMaterial *)0x0) {
          if (mnode->ptr == (MaterialNode *)0x0) {
            pMVar7 = (MetalMaterial *)0x0;
          }
          else {
            pMVar7 = (MetalMaterial *)
                     __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                    &MetalMaterial::typeinfo,0);
          }
          if (pMVar7 == (MetalMaterial *)0x0) {
            if (mnode->ptr == (MaterialNode *)0x0) {
              pVVar8 = (VelvetMaterial *)0x0;
            }
            else {
              pVVar8 = (VelvetMaterial *)
                       __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                      &VelvetMaterial::typeinfo,0);
            }
            if (pVVar8 == (VelvetMaterial *)0x0) {
              if (mnode->ptr == (MaterialNode *)0x0) {
                pDVar9 = (DielectricMaterial *)0x0;
              }
              else {
                pDVar9 = (DielectricMaterial *)
                         __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                        &DielectricMaterial::typeinfo,0);
              }
              if (pDVar9 == (DielectricMaterial *)0x0) {
                if (mnode->ptr == (MaterialNode *)0x0) {
                  pMVar10 = (MetallicPaintMaterial *)0x0;
                }
                else {
                  pMVar10 = (MetallicPaintMaterial *)
                            __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                           &MetallicPaintMaterial::typeinfo,0);
                }
                if (pMVar10 == (MetallicPaintMaterial *)0x0) {
                  if (mnode->ptr == (MaterialNode *)0x0) {
                    pMVar11 = (MatteMaterial *)0x0;
                  }
                  else {
                    pMVar11 = (MatteMaterial *)
                              __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                             &MatteMaterial::typeinfo,0);
                  }
                  if (pMVar11 == (MatteMaterial *)0x0) {
                    if (mnode->ptr == (MaterialNode *)0x0) {
                      pMVar12 = (MirrorMaterial *)0x0;
                    }
                    else {
                      pMVar12 = (MirrorMaterial *)
                                __dynamic_cast(mnode->ptr,&SceneGraph::MaterialNode::typeinfo,
                                               &MirrorMaterial::typeinfo,0);
                    }
                    if (pMVar12 == (MirrorMaterial *)0x0) {
                      if (mnode->ptr == (MaterialNode *)0x0) {
                        plVar2 = (long *)0x0;
                      }
                      else {
                        plVar2 = (long *)__dynamic_cast(mnode->ptr,
                                                        &SceneGraph::MaterialNode::typeinfo,
                                                        &MetalMaterial::typeinfo,0);
                      }
                      if (plVar2 == (long *)0x0) {
                        if (mnode->ptr == (MaterialNode *)0x0) {
                          plVar13 = (long *)0x0;
                        }
                        else {
                          plVar13 = (long *)__dynamic_cast(mnode->ptr,
                                                           &SceneGraph::MaterialNode::typeinfo,
                                                           &HairMaterial::typeinfo,0);
                        }
                        if (plVar13 == (long *)0x0) {
                          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_00,"unsupported material");
                          __cxa_throw(this_00,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        (**(code **)(*plVar13 + 0x10))(plVar13);
                        local_b0._16_8_ = plVar13;
                        (**(code **)(*plVar13 + 0x10))(plVar13);
                        store(this,(Ref<embree::HairMaterial> *)(local_b0 + 0x10),id);
                        (**(code **)(*plVar13 + 0x18))(plVar13);
                        (**(code **)(*plVar13 + 0x18))(plVar13);
                      }
                      else {
                        (**(code **)(*plVar2 + 0x10))(plVar2);
                        local_b0._24_8_ = plVar2;
                        (**(code **)(*plVar2 + 0x10))();
                        store(this,(Ref<embree::MetalMaterial> *)(local_b0 + 0x18),id);
                        (**(code **)(*plVar2 + 0x18))();
                      }
                      if (plVar2 != (long *)0x0) {
                        (**(code **)(*plVar2 + 0x18))();
                      }
                    }
                    else {
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])()
                      ;
                      local_90.ptr = pMVar12;
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])()
                      ;
                      store(this,&local_90,id);
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])()
                      ;
                    }
                    if (pMVar12 != (MirrorMaterial *)0x0) {
                      (*(pMVar12->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])()
                      ;
                    }
                  }
                  else {
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
                    local_88.ptr = pMVar11;
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
                    store(this,&local_88,id);
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
                  }
                  if (pMVar11 != (MatteMaterial *)0x0) {
                    (*(pMVar11->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
                  }
                }
                else {
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
                  local_80.ptr = pMVar10;
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
                  store(this,&local_80,id);
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
                }
                if (pMVar10 != (MetallicPaintMaterial *)0x0) {
                  (*(pMVar10->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
                }
              }
              else {
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
                local_78.ptr = pDVar9;
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
                store(this,&local_78,id);
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
              }
              if (pDVar9 != (DielectricMaterial *)0x0) {
                (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
              }
            }
            else {
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
              local_70.ptr = pVVar8;
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])();
              store(this,&local_70,id);
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
            }
            if (pVVar8 != (VelvetMaterial *)0x0) {
              (*(pVVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])();
            }
          }
          else {
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar7);
            local_68.ptr = pMVar7;
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pMVar7);
            store(this,&local_68,id);
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pMVar7);
          }
          if (pMVar7 != (MetalMaterial *)0x0) {
            (*(pMVar7->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pMVar7);
          }
        }
        else {
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pTVar6);
          local_60.ptr = pTVar6;
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pTVar6);
          store(this,&local_60,id);
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pTVar6);
        }
        if (pTVar6 != (ThinDielectricMaterial *)0x0) {
          (*(pTVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pTVar6);
        }
      }
      else {
        (*(pOVar4->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar4);
        local_58.ptr = pOVar4;
        (*(pOVar4->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar4);
        store(this,&local_58,id);
        (*(pOVar4->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar4);
      }
      if (pOVar4 != (OBJMaterial *)0x0) {
        (*(pOVar4->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar4);
      }
    }
    else {
      if (this->ident != 0) {
        uVar17 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
          uVar17 = uVar17 + 1;
        } while (uVar17 < this->ident);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->field_0x10,"<material id=\"",0xe);
      std::
      map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
      ::operator[](&this->nodeMap,&local_c0);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"/>",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (local_c0.ptr != (Node *)0x0) {
      (*(((Node *)&(local_c0.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::MaterialNode> mnode)
  {
    /* let materials reference by their name, allows separate bindings of materials */
    if (referenceMaterials) {
      tab(); xml << "<material id=\""+mnode->name+"\"/>" << std::endl;
      return;
    }
    
    Ref<SceneGraph::Node> node = mnode.dynamicCast<SceneGraph::Node>();
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<material id=\"" << nodeMap[node] << "\"/>" << std::endl;
      return;
    }
    const ssize_t id = nodeMap[node] = currentNodeID++;

    if      (Ref<OBJMaterial> m = mnode.dynamicCast<OBJMaterial>()) store(m,id);
    else if (Ref<ThinDielectricMaterial> m = mnode.dynamicCast<ThinDielectricMaterial>()) store(m,id);
    else if (Ref<MetalMaterial> m = mnode.dynamicCast<MetalMaterial>()) store(m,id);
    else if (Ref<VelvetMaterial> m = mnode.dynamicCast<VelvetMaterial>()) store(m,id);
    else if (Ref<DielectricMaterial> m = mnode.dynamicCast<DielectricMaterial>()) store(m,id);
    else if (Ref<MetallicPaintMaterial> m = mnode.dynamicCast<MetallicPaintMaterial>()) store(m,id);
    else if (Ref<MatteMaterial> m = mnode.dynamicCast<MatteMaterial>()) store(m,id);
    else if (Ref<MirrorMaterial> m = mnode.dynamicCast<MirrorMaterial>()) store(m,id);
    else if (Ref<ReflectiveMetalMaterial> m = mnode.dynamicCast<ReflectiveMetalMaterial>()) store(m,id);
    else if (Ref<HairMaterial> m = mnode.dynamicCast<HairMaterial>()) store(m,id);
    else throw std::runtime_error("unsupported material");
  }